

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

string * __thiscall
duckdb::DecimalStatsUnifier<long>::StatsToString
          (string *__return_storage_ptr__,DecimalStatsUnifier<long> *this,string *stats)

{
  Value local_50 [64];
  
  if (stats->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    duckdb::Value::DECIMAL
              ((long)local_50,(uchar)*(undefined8 *)(stats->_M_dataplus)._M_p,this->width);
    duckdb::Value::ToString_abi_cxx11_();
    duckdb::Value::~Value(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string StatsToString(const string &stats) override {
		if (stats.empty()) {
			return string();
		}
		auto numeric_val = Load<T>(const_data_ptr_cast(stats.data()));
		return Value::DECIMAL(numeric_val, width, scale).ToString();
	}